

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int Gia_ManHashMuxReal(Gia_Man_t *p,int iLitC,int iLit1,int iLit0)

{
  int iVar1;
  int iVar2;
  int local_4c;
  int local_3c;
  int local_38;
  int *piStack_30;
  int iNode;
  int *pPlace;
  int fCompl;
  int iLit0_local;
  int iLit1_local;
  int iLitC_local;
  Gia_Man_t *p_local;
  
  if (p->fAddStrash != 0) {
    __assert_fail("p->fAddStrash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0x20c,"int Gia_ManHashMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLitC < 2) {
    local_38 = iLit0;
    if (iLitC != 0) {
      local_38 = iLit1;
    }
    p_local._4_4_ = local_38;
  }
  else if (iLit0 < 2) {
    if (iLit0 == 0) {
      local_3c = Gia_ManHashAnd(p,iLitC,iLit1);
    }
    else {
      iVar1 = Abc_LitNot(iLitC);
      local_3c = Gia_ManHashOr(p,iVar1,iLit1);
    }
    p_local._4_4_ = local_3c;
  }
  else if (iLit1 < 2) {
    if (iLit1 == 0) {
      iVar1 = Abc_LitNot(iLitC);
      local_4c = Gia_ManHashAnd(p,iVar1,iLit0);
    }
    else {
      local_4c = Gia_ManHashOr(p,iLitC,iLit0);
    }
    p_local._4_4_ = local_4c;
  }
  else {
    if (((iLit0 < 2) || (iLit1 < 2)) || (iLitC < 2)) {
      __assert_fail("iLit0 > 1 && iLit1 > 1 && iLitC > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                    ,0x213,"int Gia_ManHashMuxReal(Gia_Man_t *, int, int, int)");
    }
    p_local._4_4_ = iLit0;
    if (iLit0 != iLit1) {
      if ((iLitC == iLit0) || (iVar1 = Abc_LitNot(iLit1), iLitC == iVar1)) {
        p_local._4_4_ = Gia_ManHashAnd(p,iLit0,iLit1);
      }
      else if ((iLitC == iLit1) || (iVar1 = Abc_LitNot(iLit0), iLitC == iVar1)) {
        p_local._4_4_ = Gia_ManHashOr(p,iLit0,iLit1);
      }
      else {
        iVar1 = Abc_Lit2Var(iLit0);
        iVar2 = Abc_Lit2Var(iLit1);
        if (iVar1 == iVar2) {
          p_local._4_4_ = Gia_ManHashXorReal(p,iLitC,iLit0);
        }
        else {
          pPlace._4_4_ = iLit0;
          fCompl = iLit1;
          iLit0_local = iLitC;
          if (iLit1 < iLit0) {
            iLit0_local = Abc_LitNot(iLitC);
            pPlace._4_4_ = iLit1;
            fCompl = iLit0;
          }
          iVar1 = Abc_LitIsCompl(fCompl);
          if (iVar1 != 0) {
            pPlace._4_4_ = Abc_LitNot(pPlace._4_4_);
            fCompl = Abc_LitNot(fCompl);
          }
          pPlace._0_4_ = (uint)(iVar1 != 0);
          piStack_30 = Gia_ManHashFind(p,pPlace._4_4_,fCompl,iLit0_local);
          if (*piStack_30 == 0) {
            p->nHashMiss = p->nHashMiss + 1;
            iVar1 = Vec_IntSize(&p->vHash);
            iVar2 = Vec_IntCap(&p->vHash);
            if (iVar1 < iVar2) {
              iVar1 = Gia_ManAppendMuxReal(p,iLit0_local,fCompl,pPlace._4_4_);
              iVar1 = Abc_Lit2Var(iVar1);
              *piStack_30 = iVar1;
            }
            else {
              iVar1 = Gia_ManAppendMuxReal(p,iLit0_local,fCompl,pPlace._4_4_);
              piStack_30 = Gia_ManHashFind(p,pPlace._4_4_,fCompl,iLit0_local);
              if (*piStack_30 != 0) {
                __assert_fail("*pPlace == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                              ,0x22e,"int Gia_ManHashMuxReal(Gia_Man_t *, int, int, int)");
              }
              iVar1 = Abc_Lit2Var(iVar1);
              *piStack_30 = iVar1;
            }
            p_local._4_4_ = Abc_Var2Lit(*piStack_30,(uint)pPlace);
          }
          else {
            p->nHashHit = p->nHashHit + 1;
            p_local._4_4_ = Abc_Var2Lit(*piStack_30,(uint)pPlace);
          }
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManHashMuxReal( Gia_Man_t * p, int iLitC, int iLit1, int iLit0 )  
{
    int fCompl = 0;
    assert( p->fAddStrash == 0 );
    if ( iLitC < 2 )
        return iLitC ? iLit1 : iLit0;
    if ( iLit0 < 2 )
        return iLit0 ? Gia_ManHashOr(p, Abc_LitNot(iLitC), iLit1) : Gia_ManHashAnd(p, iLitC, iLit1);
    if ( iLit1 < 2 )
        return iLit1 ? Gia_ManHashOr(p, iLitC, iLit0) : Gia_ManHashAnd(p, Abc_LitNot(iLitC), iLit0);
    assert( iLit0 > 1 && iLit1 > 1 && iLitC > 1 );
    if ( iLit0 == iLit1 )
        return iLit0;
    if ( iLitC == iLit0 || iLitC == Abc_LitNot(iLit1) )
        return Gia_ManHashAnd(p, iLit0, iLit1);
    if ( iLitC == iLit1 || iLitC == Abc_LitNot(iLit0) )
        return Gia_ManHashOr(p, iLit0, iLit1);
    if ( Abc_Lit2Var(iLit0) == Abc_Lit2Var(iLit1) )
        return Gia_ManHashXorReal( p, iLitC, iLit0 );
    if ( iLit0 > iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1, iLitC = Abc_LitNot(iLitC);
    if ( Abc_LitIsCompl(iLit1) )
        iLit0 = Abc_LitNot(iLit0), iLit1 = Abc_LitNot(iLit1), fCompl = 1;
    {
        int *pPlace = Gia_ManHashFind( p, iLit0, iLit1, iLitC );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, fCompl );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendMuxReal( p, iLitC, iLit1, iLit0 ) );
        else
        {
            int iNode = Gia_ManAppendMuxReal( p, iLitC, iLit1, iLit0 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, iLitC );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, fCompl );
    }
}